

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O3

int coda_time_double_to_parts_utc
              (double datetime,int *year,int *month,int *day,int *hour,int *minute,int *second,
              int *musec)

{
  double *pdVar1;
  long lVar2;
  bool bVar3;
  undefined4 in_EAX;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  char *message;
  long in_FS_OFFSET;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  int y;
  int m;
  int d;
  int local_54;
  int local_50;
  int local_4c;
  ulong local_48;
  int *local_40;
  double local_38;
  
  auVar10._0_4_ = -(uint)(year == (int *)0x0);
  auVar10._4_4_ = -(uint)(month == (int *)0x0);
  auVar10._8_4_ = -(uint)(day == (int *)0x0);
  auVar10._12_4_ = -(uint)(hour == (int *)0x0);
  iVar4 = movmskps(in_EAX,auVar10);
  if ((((iVar4 == 0) && (minute != (int *)0x0)) && (second != (int *)0x0)) && (musec != (int *)0x0))
  {
    iVar4 = coda_isNaN(datetime);
    if (iVar4 == 0) {
      iVar4 = coda_isInf(datetime);
      if (iVar4 == 0) {
        local_38 = floor(datetime + 5e-07);
        lVar2 = *(long *)(in_FS_OFFSET + -0x108);
        if (lVar2 != 0) {
          uVar6 = *(uint *)(in_FS_OFFSET + -0x100);
          uVar5 = (ulong)uVar6;
          if (0 < (int)uVar6) {
            uVar7 = 0;
            do {
              pdVar1 = (double *)(lVar2 + uVar7 * 8);
              if (local_38 < *pdVar1 || local_38 == *pdVar1) {
                uVar6 = (uint)uVar7;
                uVar5 = uVar7;
                break;
              }
              uVar7 = uVar7 + 1;
            } while (uVar5 != uVar7);
            bVar3 = ABS(local_38 - *(double *)(lVar2 + uVar5 * 8)) < 0.1;
            local_48 = (ulong)bVar3;
            dVar9 = (double)(int)(uVar6 + bVar3 + 10);
            local_38 = local_38 - dVar9;
            local_40 = second;
            dVar8 = floor(local_38 / 86400.0);
            iVar4 = mjd2000_to_dmy((int)dVar8,&local_4c,&local_50,&local_54);
            if (iVar4 != 0) {
              return -1;
            }
            uVar6 = (uint)((double)(int)dVar8 * -86400.0 + local_38);
            if (0x1517f < uVar6) {
              coda_set_error(-0x68,"dayseconds argument (%d) is not in the range [0,86400)");
              return -1;
            }
            dVar8 = floor((((datetime + 5e-07) - dVar9) - local_38) * 1000000.0);
            *year = local_54;
            *month = local_50;
            *day = local_4c;
            *hour = uVar6 / 0xe10;
            *minute = (uVar6 % 0xe10) / 0x3c;
            *local_40 = (uVar6 % 0xe10) % 0x3c + (int)local_48;
            *musec = (int)dVar8;
            return 0;
          }
        }
        __assert_fail("leap_second_table != NULL && num_leap_seconds > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-time.c"
                      ,0x37e,
                      "int coda_time_double_to_parts_utc(double, int *, int *, int *, int *, int *, int *, int *)"
                     );
      }
      message = "datetime argument is Infinite";
    }
    else {
      message = "datetime argument is NaN";
    }
    coda_set_error(-0x68,message);
  }
  else {
    coda_set_error(-100,"date/time argument(s) are NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-time.c"
                   ,0x36a);
  }
  return -1;
}

Assistant:

LIBCODA_API int coda_time_double_to_parts_utc(double datetime, int *year, int *month, int *day, int *hour, int *minute,
                                              int *second, int *musec)
{
    double seconds;
    int d, m, y;
    int h, min, s, us;
    int days, dayseconds;
    int leap_sec;
    int is_leap_sec;

    if (year == NULL || month == NULL || day == NULL || hour == NULL || minute == NULL || second == NULL ||
        musec == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "date/time argument(s) are NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (coda_isNaN(datetime))
    {
        coda_set_error(CODA_ERROR_INVALID_DATETIME, "datetime argument is NaN");
        return -1;
    }
    if (coda_isInf(datetime))
    {
        coda_set_error(CODA_ERROR_INVALID_DATETIME, "datetime argument is Infinite");
        return -1;
    }

    /* we add 0.5 milliseconds so the floor() becomes a round() that rounds at the millisecond */
    datetime += 5E-7;

    seconds = floor(datetime);

    assert(leap_second_table != NULL && num_leap_seconds > 0);
    leap_sec = 0;
    while (leap_sec < num_leap_seconds && seconds > leap_second_table[leap_sec])
    {
        leap_sec++;
    }
    is_leap_sec = fabs(seconds - leap_second_table[leap_sec]) < 0.1;
    seconds -= 10 + leap_sec + is_leap_sec;
    datetime -= 10 + leap_sec + is_leap_sec;

    days = (int)floor(seconds / 86400.0);

    if (mjd2000_to_dmy(days, &d, &m, &y) != 0)
    {
        return -1;
    }

    dayseconds = (int)(seconds - days * 86400.0);

    if (seconds_to_hms(dayseconds, &h, &min, &s) != 0)
    {
        return -1;
    }

    us = (int)floor((datetime - seconds) * 1E6);

    *year = y;
    *month = m;
    *day = d;
    *hour = h;
    *minute = min;
    *second = s + is_leap_sec;
    *musec = us;

    return 0;
}